

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O1

void Eto63(Clifford *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  vector<Blade,_std::allocator<Blade>_> local_238;
  vector<Blade,_std::allocator<Blade>_> local_220;
  Clifford local_208;
  vector<Blade,_std::allocator<Blade>_> local_1f0;
  Clifford local_1d8;
  vector<Blade,_std::allocator<Blade>_> local_1c0;
  Clifford local_1a8;
  Clifford local_190;
  Clifford local_178;
  Clifford local_160;
  vector<Blade,_std::allocator<Blade>_> local_148;
  Clifford local_130;
  vector<Blade,_std::allocator<Blade>_> local_118;
  vector<Blade,_std::allocator<Blade>_> local_100;
  Clifford local_e8;
  vector<Blade,_std::allocator<Blade>_> local_d0;
  vector<Blade,_std::allocator<Blade>_> local_b8;
  Clifford local_a0;
  vector<Blade,_std::allocator<Blade>_> local_88;
  vector<Blade,_std::allocator<Blade>_> local_70;
  Clifford local_58;
  Clifford local_40;
  vector<Blade,_std::allocator<Blade>_> local_28;
  
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_70,p);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_88,&e1);
  operator|(&local_58,&local_70,&local_88);
  if (local_58.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_58.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    fVar1 = 0.0;
  }
  else {
    fVar1 = (local_58.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
             super__Vector_impl_data._M_start)->mVal;
  }
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_58);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_88);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_70);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_b8,p);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_d0,&e2);
  operator|(&local_a0,&local_b8,&local_d0);
  if (local_a0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_a0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    fVar2 = 0.0;
  }
  else {
    fVar2 = (local_a0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
             super__Vector_impl_data._M_start)->mVal;
  }
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_a0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_d0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_b8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_100,p);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_118,&e3);
  operator|(&local_e8,&local_100,&local_118);
  if (local_e8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_e8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    fVar3 = 0.0;
  }
  else {
    fVar3 = (local_e8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
             super__Vector_impl_data._M_start)->mVal;
  }
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_e8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_118);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_100);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_148,p);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_1c0,&ex);
  operator*(&local_1a8,fVar1 * fVar1,&local_1c0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_1f0,&ey);
  operator*(&local_1d8,fVar2 * fVar2,&local_1f0);
  operator+(&local_190,&local_1a8,&local_1d8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_220,&ez);
  operator*(&local_208,fVar3 * fVar3,&local_220);
  operator+(&local_178,&local_190,&local_208);
  operator*(&local_160,0.5,&local_178);
  operator+(&local_130,&local_148,&local_160);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_238,&eo);
  operator+(&local_40,&local_130,&local_238);
  local_28.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (p->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
             _M_start;
  local_28.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (p->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data
              ._M_finish;
  local_28.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (p->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (p->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data._M_start =
       local_40.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (p->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data._M_finish =
       local_40.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (p->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_40.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_40.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_40.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_40.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_28);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_40);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_238);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_130);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_160);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_178);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_208);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_220);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_190);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1d8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1f0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1a8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1c0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_148);
  return;
}

Assistant:

void Eto63(Clifford &p)
{
   float x;x<=(p|e1);
   float y;y<=(p|e2);
   float z;z<=(p|e3);
   p=p+0.5*(x*x*ex+y*y*ey+z*z*ez)+eo;
}